

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O0

void __thiscall BaseNode::RenderSlot(BaseNode *this,char *slot_title,int kind)

{
  bool bVar1;
  ImU32 col;
  ImGuiID id;
  ImDrawList *this_00;
  ImGuiWindow *pIVar2;
  uint uVar3;
  float fVar4;
  byte local_ca;
  byte local_c9;
  ImVec2 local_b4;
  ImVec2 local_ac;
  float local_a4;
  float circle_offset_y;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  undefined1 local_80 [8];
  ImRect circle_rect;
  float offset;
  ImColor color;
  bool is_active;
  ImDrawList *draw_lists;
  ImVec2 local_48;
  ImVec2 local_40;
  float local_38;
  float fStack_34;
  float item_offset_x;
  ImVec2 title_size;
  float CIRCLE_RADIUS;
  ImGuiStyle *style;
  int kind_local;
  char *slot_title_local;
  BaseNode *this_local;
  
  register0x00000000 = ImGui::GetStyle();
  title_size.x = gCanvas->zoom * 5.0;
  _fStack_34 = ImGui::CalcTextSize(slot_title,(char *)0x0,false,-1.0);
  local_38 = (stack0xffffffffffffffd8->ItemSpacing).x * gCanvas->zoom;
  bVar1 = ImNodes::IsOutputSlotKind(kind);
  if (!bVar1) {
    local_38 = -local_38;
  }
  local_48 = ImGui::GetCursorScreenPos();
  ImVec2::ImVec2((ImVec2 *)&draw_lists,local_38,0.0);
  local_40 = operator+(&local_48,(ImVec2 *)&draw_lists);
  ImGui::SetCursorScreenPos(&local_40);
  bVar1 = ImNodes::BeginSlot(slot_title,kind);
  if (bVar1) {
    this_00 = ImGui::GetWindowDrawList();
    bVar1 = ImNodes::IsSlotCurveHovered();
    local_c9 = 1;
    if (!bVar1) {
      bVar1 = ImNodes::IsConnectingCompatibleSlot();
      local_ca = 0;
      if (bVar1) {
        bVar1 = IsAlreadyConnectedWithPendingConnection(this,slot_title,kind);
        local_ca = bVar1 ^ 0xff;
      }
      local_c9 = local_ca;
    }
    uVar3 = 4;
    if ((local_c9 & 1) != 0) {
      uVar3 = 5;
    }
    circle_rect.Max.y = gCanvas->colors[uVar3].Value.x;
    unique0x00012004 = gCanvas->colors[uVar3].Value.y;
    ImGui::PushStyleColor(0,(ImVec4 *)&circle_rect.Max.y);
    bVar1 = ImNodes::IsOutputSlotKind(kind);
    if (bVar1) {
      fVar4 = ImMax<float>(this->output_max_title_width,fStack_34);
      this->output_max_title_width = fVar4;
      circle_rect.Max.x =
           (this->output_max_title_width + (stack0xffffffffffffffd8->ItemSpacing).x) - fStack_34;
      fVar4 = ImGui::GetCursorPosX();
      ImGui::SetCursorPosX(fVar4 + circle_rect.Max.x);
      ImGui::TextUnformatted(slot_title,(char *)0x0);
      ImGui::SameLine(0.0,-1.0);
    }
    local_88 = ImGui::GetCursorScreenPos();
    local_98 = ImGui::GetCursorScreenPos();
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,title_size.x + title_size.x,
                   title_size.x + title_size.x);
    local_90 = operator+(&local_98,(ImVec2 *)&stack0xffffffffffffff60);
    ImRect::ImRect((ImRect *)local_80,&local_88,&local_90);
    local_a4 = item_offset_x * 0.5 - title_size.x;
    local_80._4_4_ = (float)local_80._4_4_ + local_a4;
    circle_rect.Min.y = circle_rect.Min.y + local_a4;
    local_ac = ImRect::GetCenter((ImRect *)local_80);
    fVar4 = title_size.x;
    col = ImColor::operator_cast_to_unsigned_int((ImColor *)&circle_rect.Max.y);
    ImDrawList::AddCircleFilled(this_00,&local_ac,fVar4,col,0xc);
    local_b4 = ImRect::GetSize((ImRect *)local_80);
    ImGui::ItemSize(&local_b4,0.0);
    id = ImGui::GetID(this->title);
    ImGui::ItemAdd((ImRect *)local_80,id,(ImRect *)0x0);
    bVar1 = ImNodes::IsInputSlotKind(kind);
    if (bVar1) {
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextUnformatted(slot_title,(char *)0x0);
    }
    ImGui::PopStyleColor(1);
    ImNodes::EndSlot();
    fVar4 = local_38;
    pIVar2 = ImGui::GetCurrentWindow();
    (pIVar2->DC).CursorMaxPos.x = (pIVar2->DC).CursorMaxPos.x - fVar4;
  }
  return;
}

Assistant:

void RenderSlot(const char* slot_title, int kind)
    {
        const auto& style = ImGui::GetStyle();
        const float CIRCLE_RADIUS = 5.f * gCanvas->zoom;
        ImVec2 title_size = ImGui::CalcTextSize(slot_title);
        // Pull entire slot a little bit out of the edge so that curves connect into int without visible seams
        float item_offset_x = style.ItemSpacing.x * gCanvas->zoom;
        if (!ImNodes::IsOutputSlotKind(kind))
            item_offset_x = -item_offset_x;
        ImGui::SetCursorScreenPos(ImGui::GetCursorScreenPos() + ImVec2{item_offset_x, 0});

        if (ImNodes::BeginSlot(slot_title, kind))
        {
            auto* draw_lists = ImGui::GetWindowDrawList();

            // Slot appearance can be altered depending on curve hovering state.
            bool is_active = ImNodes::IsSlotCurveHovered() ||
                (ImNodes::IsConnectingCompatibleSlot() && !IsAlreadyConnectedWithPendingConnection(slot_title, kind));

            ImColor color = gCanvas->colors[is_active ? ImNodes::ColConnectionActive : ImNodes::ColConnection];

            ImGui::PushStyleColor(ImGuiCol_Text, color.Value);

            if (ImNodes::IsOutputSlotKind(kind))
            {
                // Align output slots to the right edge of the node.
                output_max_title_width = ImMax(output_max_title_width, title_size.x);
                float offset = (output_max_title_width + style.ItemSpacing.x) - title_size.x;
                ImGui::SetCursorPosX(ImGui::GetCursorPosX() + offset);

                ImGui::TextUnformatted(slot_title);
                ImGui::SameLine();
            }

            ImRect circle_rect{
                ImGui::GetCursorScreenPos(),
                ImGui::GetCursorScreenPos() + ImVec2{CIRCLE_RADIUS * 2, CIRCLE_RADIUS * 2}
            };
            // Vertical-align circle in the middle of the line.
            float circle_offset_y = title_size.y / 2.f - CIRCLE_RADIUS;
            circle_rect.Min.y += circle_offset_y;
            circle_rect.Max.y += circle_offset_y;
            draw_lists->AddCircleFilled(circle_rect.GetCenter(), CIRCLE_RADIUS, color);

            ImGui::ItemSize(circle_rect.GetSize());
            ImGui::ItemAdd(circle_rect, ImGui::GetID(title));

            if (ImNodes::IsInputSlotKind(kind))
            {
                ImGui::SameLine();
                ImGui::TextUnformatted(slot_title);
            }

            ImGui::PopStyleColor();
            ImNodes::EndSlot();

            // A dirty trick to place output slot circle on the border.
            ImGui::GetCurrentWindow()->DC.CursorMaxPos.x -= item_offset_x;
        }
    }